

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  pointer ppTVar2;
  long lVar3;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    internal::MutexBase::Lock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
    (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
    internal::MutexBase::Unlock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
    ppTVar2 = (this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) >> 3)) {
      lVar3 = 0;
      do {
        TestInfo::Skip(ppTVar2[(uint)(this->test_indices_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar3]]);
        lVar3 = lVar3 + 1;
        ppTVar2 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar2) >> 3));
    }
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar1,this);
    UnitTest::GetInstance();
    internal::MutexBase::Lock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
    (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = (TestSuite *)0x0;
    internal::MutexBase::Unlock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
    return;
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}